

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

void singleOptionHelp(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  char cVar5;
  int iVar6;
  char *__s;
  ushort **ppuVar7;
  size_t sVar8;
  char *__s_00;
  char *pcVar9;
  byte *__s_01;
  void *pvVar10;
  size_t sVar11;
  uint uVar12;
  float fVar13;
  double *pdVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  char *__src;
  byte *pbVar18;
  size_t sVar19;
  byte *__s_02;
  byte bVar20;
  double dVar21;
  byte *pbVar22;
  byte *local_70;
  int local_40;
  
  sVar4 = columns->cur;
  sVar11 = columns->max;
  __s_02 = (byte *)opt->descrip;
  __s = getArgDescrip(opt,(char *)columns);
  ppuVar7 = __ctype_b_loc();
  cVar5 = opt->shortName;
  bVar20 = (long)cVar5 != 0x20;
  bVar3 = *(byte *)((long)*ppuVar7 + (long)cVar5 * 2 + 1);
  sVar19 = sVar4 + 1;
  pcVar15 = opt->longName;
  if (pcVar15 != (char *)0x0) {
    sVar8 = strlen(pcVar15);
    sVar19 = sVar19 + sVar8;
  }
  uVar12 = opt->argInfo;
  sVar8 = sVar19 + 4;
  if ((uVar12 >> 0x15 & 1) == 0) {
    sVar8 = sVar19;
  }
  if (__s != (char *)0x0) {
    sVar19 = strlen(__s);
    sVar8 = sVar8 + sVar19;
  }
  __s_00 = (char *)malloc(sVar8);
  if (__s_00 == (char *)0x0) {
    return;
  }
  *__s_00 = '\0';
  __s_00[sVar4] = '\0';
  if ((bVar20 & (bVar3 & 0x40) >> 6) == 0) {
    if (pcVar15 == (char *)0x0) {
      __s_01 = (byte *)0x0;
      goto LAB_00106c24;
    }
    pcVar9 = "-";
    if (-1 < (int)uVar12) {
      pcVar9 = "--";
    }
    __src = "";
    if ((_poptArgMask & uVar12) == 0x1b) {
      pcVar9 = "";
    }
    if ((((uVar12 >> 0x15 & 1) != 0) && (__src = "[no]", *pcVar15 == 'n')) && (pcVar15[1] == 'o')) {
      pcVar1 = pcVar15 + 3;
      pcVar2 = pcVar15 + 2;
      pcVar15 = pcVar15 + 2;
      if (*pcVar2 == '-') {
        pcVar15 = pcVar1;
      }
    }
    builtin_strncpy(__s_00,"    ",5);
    pcVar9 = stpcpy(__s_00 + 4,pcVar9);
LAB_00106723:
    pcVar9 = stpcpy(pcVar9,__src);
    strcpy(pcVar9,pcVar15);
  }
  else {
    if (pcVar15 != (char *)0x0) {
      __src = "-";
      if (-1 < (int)uVar12) {
        __src = "--";
      }
      *__s_00 = '-';
      __s_00[1] = cVar5;
      pcVar9 = __s_00 + 4;
      __s_00[2] = ',';
      __s_00[3] = ' ';
      __s_00[4] = '\0';
      goto LAB_00106723;
    }
    *__s_00 = '-';
    __s_00[1] = cVar5;
    __s_00[2] = '\0';
  }
  uVar16 = sVar11 - (sVar4 + 5);
  if (__s == (char *)0x0) {
    iVar6 = 0;
    __s_01 = (byte *)0x0;
    goto LAB_00106aa9;
  }
  sVar19 = strlen(__s_00);
  pcVar15 = __s_00 + sVar19;
  uVar12 = opt->argInfo;
  if ((uVar12 >> 0x1c & 1) != 0) {
    *pcVar15 = '[';
    pcVar15 = pcVar15 + 1;
  }
  if (((uVar12 >> 0x17 & 1) == 0) ||
     (__s_01 = (byte *)malloc(uVar16 * 4 + 1), __s_01 == (byte *)0x0)) {
    __s_01 = (byte *)0x0;
    goto LAB_001069b0;
  }
  *__s_01 = 0x28;
  __s_01[1] = 100;
  __s_01[2] = 0x65;
  __s_01[3] = 0x66;
  __s_01[4] = 0x61;
  __s_01[5] = 0x75;
  __s_01[6] = 0x6c;
  __s_01[7] = 0x74;
  __s_01[8] = 0x3a;
  pbVar18 = __s_01 + 10;
  __s_01[9] = 0x20;
  pdVar14 = (double *)opt->arg;
  pbVar22 = __s_01;
  if (pdVar14 == (double *)0x0) goto LAB_00106931;
  local_70 = (byte *)0x0;
  switch(uVar12 & _poptArgMask) {
  case 1:
    pcVar9 = (char *)*pdVar14;
    if (pcVar9 == (char *)0x0) {
      __s_01[0xe] = 0;
      pbVar18[0] = 0x6e;
      pbVar18[1] = 0x75;
      pbVar18[2] = 0x6c;
      pbVar18[3] = 0x6c;
      pbVar18 = __s_01 + 0xe;
    }
    else {
      sVar19 = uVar16 * 4 - 0xe;
      pbVar18 = __s_01 + 0xb;
      __s_01[10] = 0x22;
      strncpy((char *)pbVar18,pcVar9,sVar19);
      __s_01[uVar16 * 4 + -3] = 0;
      pbVar22 = __s_01;
      sVar8 = strlen((char *)pbVar18);
      if ((sVar8 == sVar19) && (pcVar9[sVar19] != '\0')) {
        (__s_01 + sVar8 + 8)[0] = 0x2e;
        (__s_01 + sVar8 + 8)[1] = 0x2e;
        __s_01[sVar8 + 10] = 0x2e;
      }
      __s_01[sVar8 + 0xb] = 0x22;
      pbVar18 = __s_01 + sVar8 + 0xc;
    }
    goto LAB_00106931;
  case 2:
  case 7:
    fVar13 = *(float *)pdVar14;
    pcVar9 = "%d";
    goto LAB_0010685e;
  case 3:
    pdVar14 = (double *)*pdVar14;
    pcVar9 = "%ld";
    break;
  case 4:
  case 5:
  case 6:
  case 0xb:
    goto switchD_00106804_caseD_4;
  case 8:
    dVar21 = (double)*(float *)pdVar14;
    goto LAB_00106871;
  case 9:
    dVar21 = *pdVar14;
LAB_00106871:
    iVar6 = sprintf((char *)pbVar18,"%g",dVar21);
    goto LAB_00106929;
  case 10:
    pdVar14 = (double *)*pdVar14;
    pcVar9 = "%lld";
    break;
  case 0xc:
switchD_00106804_caseD_c:
    pcVar9 = "%p";
    break;
  case 0xd:
    fVar13 = (float)(int)*(short *)pdVar14;
    pcVar9 = "%hd";
LAB_0010685e:
    iVar6 = sprintf((char *)pbVar18,pcVar9,(ulong)(uint)fVar13);
    goto LAB_00106929;
  default:
    if ((uVar12 & _poptArgMask) == 0x1b) goto switchD_00106804_caseD_c;
    goto switchD_00106804_caseD_4;
  }
  iVar6 = sprintf((char *)pbVar18,pcVar9,pdVar14);
LAB_00106929:
  pbVar18 = pbVar18 + iVar6;
LAB_00106931:
  pbVar18[0] = 0x29;
  pbVar18[1] = 0;
  if (__s_02 == (byte *)0x0) {
    lVar17 = 2;
  }
  else {
    sVar19 = strlen((char *)__s_02);
    lVar17 = sVar19 + 2;
  }
  sVar19 = strlen((char *)__s_01);
  local_70 = (byte *)malloc(lVar17 + sVar19);
  if (local_70 != (byte *)0x0) {
    pbVar18 = local_70;
    __s_01 = pbVar22;
    if (__s_02 != (byte *)0x0) {
      pbVar18 = (byte *)stpcpy((char *)local_70,(char *)__s_02);
      __s_01 = pbVar22;
    }
    *pbVar18 = 0x20;
    strcpy((char *)(pbVar18 + 1),(char *)__s_01);
switchD_00106804_caseD_4:
    free(__s_01);
    __s_01 = local_70;
  }
LAB_001069b0:
  if (opt->argDescrip == (char *)0x0) {
    uVar12 = opt->argInfo;
    iVar6 = 0;
    if (((_poptArgMask & uVar12) < 0xe) && ((0x270eU >> (_poptArgMask & uVar12 & 0x1f) & 1) != 0)) {
      cVar5 = '=';
      if (opt->longName == (char *)0x0) {
        cVar5 = ' ';
      }
      *pcVar15 = cVar5;
      pcVar15 = stpcpy(pcVar15 + 1,__s);
      iVar6 = 0;
    }
  }
  else {
    pvVar10 = memchr(" =(",(int)*__s,4);
    pcVar9 = pcVar15;
    if (pvVar10 == (void *)0x0) {
      uVar12 = _poptArgMask & opt->argInfo;
      cVar5 = ' ';
      if (((uVar12 != 0xc) && (uVar12 != 0x1b)) && (cVar5 = '=', opt->longName == (char *)0x0)) {
        cVar5 = ' ';
      }
      *pcVar15 = cVar5;
      pcVar9 = pcVar15 + 1;
    }
    pcVar15 = stpcpy(pcVar9,__s);
    sVar11 = stringDisplayWidth((char *)__s_01);
    iVar6 = (int)pcVar15 - ((int)sVar11 + (int)pcVar9);
    uVar12 = opt->argInfo;
  }
  if ((uVar12 >> 0x1c & 1) != 0) {
    *pcVar15 = ']';
    pcVar15 = pcVar15 + 1;
  }
  *pcVar15 = '\0';
LAB_00106aa9:
  if (__s_02 == (byte *)0x0) {
    POPT_fprintf(fp,"  %s\n",__s_00);
  }
  else {
    local_40 = (int)sVar4;
    POPT_fprintf(fp,"  %-*s   ",(ulong)(uint)(iVar6 + local_40),__s_00);
    free(__s_00);
    if (__s_01 != (byte *)0x0) {
      __s_02 = __s_01;
    }
    sVar19 = strlen((char *)__s_02);
    while (uVar16 < sVar19) {
      pbVar18 = __s_02 + (uVar16 - 1);
      while ((__s_02 < pbVar18 &&
             ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar18 * 2 + 1) & 0x20) == 0))) {
        pbVar18 = (byte *)POPT_prev_char((char *)pbVar18);
      }
      if (pbVar18 == __s_02) break;
      while ((__s_02 + 1 < pbVar18 &&
             ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar18 * 2 + 1) & 0x20) != 0))) {
        pbVar18 = (byte *)POPT_prev_char((char *)pbVar18);
      }
      pbVar18 = (byte *)POPT_next_char((char *)pbVar18);
      sVar19 = strlen((char *)__s_02);
      pcVar15 = (char *)malloc(sVar19 + 1);
      if (pcVar15 == (char *)0x0) {
        fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
        exit(1);
      }
      strcpy(pcVar15,(char *)__s_02);
      pcVar15[(long)pbVar18 - (long)__s_02] = '\0';
      POPT_fprintf(fp,"%s\n%*s",pcVar15,sVar4 + 5," ");
      free(pcVar15);
      while ((*pbVar18 != 0 && (((*ppuVar7)[*pbVar18] & 0x2000) != 0))) {
        pbVar18 = (byte *)POPT_next_char((char *)pbVar18);
      }
      sVar19 = strlen((char *)pbVar18);
      __s_02 = pbVar18;
    }
    if (sVar19 != 0) {
      fprintf((FILE *)fp,"%s\n",__s_02);
    }
    __s_00 = (char *)0x0;
  }
LAB_00106c24:
  free(__s_01);
  free(__s_00);
  return;
}

Assistant:

static void singleOptionHelp(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char * translation_domain)
{
    size_t maxLeftCol = columns->cur;
    size_t indentLength = maxLeftCol + 5;
    size_t lineLength = columns->max - indentLength;
    const char * help = D_(translation_domain, opt->descrip);
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');
    size_t helpLength;
    char * defs = NULL;
    char * left;
    size_t nb = maxLeftCol + 1;
    int displaypad = 0;

    /* Make sure there's more than enough room in target buffer. */
    if (opt->longName)	nb += strlen(opt->longName);
    if (F_ISSET(opt, TOGGLE)) nb += sizeof("[no]") - 1;
    if (argDescrip)	nb += strlen(argDescrip);

    left = malloc(nb);
    if (left == NULL) return;	/* XXX can't happen */
    left[0] = '\0';
    left[maxLeftCol] = '\0';

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	goto out;
    if (prtshort && prtlong) {
	const char *dash = F_ISSET(opt, ONEDASH) ? "-" : "--";
	left[0] = '-';
	left[1] = opt->shortName;
	(void) stpcpy(stpcpy(stpcpy(left+2, ", "), dash), opt->longName);
    } else if (prtshort) {
	left[0] = '-';
	left[1] = opt->shortName;
	left[2] = '\0';
    } else if (prtlong) {
	/* XXX --long always padded for alignment with/without "-X, ". */
	const char *dash = poptArgType(opt) == POPT_ARG_MAINCALL ? ""
			 : (F_ISSET(opt, ONEDASH) ? "-" : "--");
	const char *longName = opt->longName;
	const char *toggle;
	if (F_ISSET(opt, TOGGLE)) {
	    toggle = "[no]";
	    if (longName[0] == 'n' && longName[1] == 'o') {
		longName += sizeof("no") - 1;
		if (longName[0] == '-')
		    longName++;
	    }
	} else
	    toggle = "";
	(void) stpcpy(stpcpy(stpcpy(stpcpy(left, "    "), dash), toggle), longName);
    }
#undef	prtlong

    if (argDescrip) {
	char * le = left + strlen(left);

	if (F_ISSET(opt, OPTIONAL))
	    *le++ = '[';

	/* Choose type of output */
	if (F_ISSET(opt, SHOW_DEFAULT)) {
	    defs = singleOptionDefaultValue(lineLength, opt, translation_domain);
	    if (defs) {
		char * t = malloc((help ? strlen(help) : 0) +
				strlen(defs) + sizeof(" "));
		if (t) {
		    char * te = t;
		    if (help)
			te = stpcpy(te, help);
		    *te++ = ' ';
		    strcpy(te, defs);
		    defs = _free(defs);
		    defs = t;
		}
	    }
	}

	if (opt->argDescrip == NULL) {
	    switch (poptArgType(opt)) {
	    case POPT_ARG_NONE:
		break;
	    case POPT_ARG_VAL:
#ifdef	NOTNOW	/* XXX pug ugly nerdy output */
	    {	long aLong = opt->val;
		int ops = F_ISSET(opt, LOGICALOPS);
		int negate = F_ISSET(opt, NOT);

		/* Don't bother displaying typical values */
		if (!ops && (aLong == 0L || aLong == 1L || aLong == -1L))
		    break;
		*le++ = '[';
		switch (ops) {
		case POPT_ARGFLAG_OR:
		    *le++ = '|';
		    break;
		case POPT_ARGFLAG_AND:
		    *le++ = '&';
		    break;
		case POPT_ARGFLAG_XOR:
		    *le++ = '^';
		    break;
		default:
		    break;
		}
		*le++ = (opt->longName != NULL ? '=' : ' ');
		if (negate) *le++ = '~';
		le += sprintf(le, (ops ? "0x%lx" : "%ld"), aLong);
		*le++ = ']';
	    }
#endif
		break;
	    case POPT_ARG_INT:
	    case POPT_ARG_SHORT:
	    case POPT_ARG_LONG:
	    case POPT_ARG_LONGLONG:
	    case POPT_ARG_FLOAT:
	    case POPT_ARG_DOUBLE:
	    case POPT_ARG_STRING:
		*le++ = (opt->longName != NULL ? '=' : ' ');
		le = stpcpy(le, argDescrip);
		break;
	    default:
		break;
	    }
	} else {
	    char *leo;

	    /* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	    if (!strchr(" =(", argDescrip[0]))
		*le++ = ((poptArgType(opt) == POPT_ARG_MAINCALL) ? ' ' :
			 (poptArgType(opt) == POPT_ARG_ARGV) ? ' ' :
			 opt->longName == NULL ? ' ' : '=');
	    le = stpcpy(leo = le, argDescrip);

	    /* Adjust for (possible) wide characters. */
	    displaypad = (int)((le - leo) - stringDisplayWidth(argDescrip));
	}
	if (F_ISSET(opt, OPTIONAL))
	    *le++ = ']';
	*le = '\0';
    }

    if (help)
	POPT_fprintf(fp,"  %-*s   ", (int)(maxLeftCol+displaypad), left);
    else {
	POPT_fprintf(fp,"  %s\n", left);
	goto out;
    }

    left = _free(left);
    if (defs)
	help = defs;

    helpLength = strlen(help);
    while (helpLength > lineLength) {
	const char * ch;

	ch = help + lineLength - 1;
	while (ch > help && !_isspaceptr(ch))
	    ch = POPT_prev_char(ch);
	if (ch == help) break;		/* give up */
	while (ch > (help + 1) && _isspaceptr(ch))
	    ch = POPT_prev_char (ch);
	ch = POPT_next_char(ch);

	/*
	 *  XXX strdup is necessary to add NUL terminator so that an unknown
	 *  no. of (possible) multi-byte characters can be displayed.
	 */
	{   char * fmthelp = xstrdup(help);
	    if (fmthelp) {
		fmthelp[ch - help] = '\0';
		POPT_fprintf(fp, "%s\n%*s", fmthelp, (int) indentLength, " ");
		free(fmthelp);
	    }
	}

	help = ch;
	while (_isspaceptr(help) && *help)
	    help = POPT_next_char(help);
	helpLength = strlen(help);
    }

    if (helpLength) fprintf(fp, "%s\n", help);
    help = NULL;

out:
    defs = _free(defs);
    left = _free(left);
}